

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O3

bool __thiscall
my_crc_basic::calc_crc
          (my_crc_basic *this,value_type use_initial,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *msg,value_type expected_crc
          ,FEED_TYPE feed_type)

{
  ulong uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  value_type vVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  size_type pos;
  
  this->rem_ = use_initial;
  switch(feed_type) {
  case AUTO:
    if (this->rft_in_ != true) goto switchD_00111163_caseD_1;
    iVar4 = (int)*(ulong *)(msg + 0x18);
    if ((*(ulong *)(msg + 0x18) & 7) != 0) goto LAB_0011121e;
  case BYTEWISE_REVERSED:
    if (*(long *)(msg + 0x18) != 0) {
      uVar8 = 0;
      do {
        uVar1 = uVar8 + 8;
        lVar7 = 7;
        do {
          bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                            (msg,uVar8 + lVar7);
          uVar6 = this->high_bit_mask;
          if (!bVar3) {
            uVar6 = 0;
          }
          uVar6 = uVar6 ^ this->rem_;
          uVar2 = uVar6 * 2;
          this->rem_ = uVar2;
          if ((uVar6 & this->high_bit_mask) != 0) {
            this->rem_ = uVar2 ^ this->poly_;
          }
          bVar3 = lVar7 != 0;
          lVar7 = lVar7 + -1;
        } while (bVar3);
        uVar8 = uVar1;
      } while (uVar1 < *(ulong *)(msg + 0x18));
    }
    break;
  case LINEAR_FORWARD:
switchD_00111163_caseD_1:
    if (*(long *)(msg + 0x18) != 0) {
      pos = 0;
      do {
        bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test(msg,pos);
        uVar6 = this->high_bit_mask;
        if (!bVar3) {
          uVar6 = 0;
        }
        uVar6 = uVar6 ^ this->rem_;
        uVar2 = uVar6 * 2;
        this->rem_ = uVar2;
        if ((uVar6 & this->high_bit_mask) != 0) {
          this->rem_ = uVar2 ^ this->poly_;
        }
        pos = pos + 1;
      } while (pos < *(ulong *)(msg + 0x18));
    }
    break;
  case LINEAR_REVERSED:
    iVar4 = (int)*(undefined8 *)(msg + 0x18);
LAB_0011121e:
    if (-1 < (int)(iVar4 - 1U)) {
      uVar8 = (ulong)(iVar4 - 1U);
      do {
        bVar3 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::test
                          (msg,uVar8);
        uVar6 = this->high_bit_mask;
        if (!bVar3) {
          uVar6 = 0;
        }
        uVar6 = uVar6 ^ this->rem_;
        uVar2 = uVar6 * 2;
        this->rem_ = uVar2;
        if ((uVar6 & this->high_bit_mask) != 0) {
          this->rem_ = uVar2 ^ this->poly_;
        }
        bVar3 = 0 < (long)uVar8;
        uVar8 = uVar8 - 1;
      } while (bVar3);
    }
  default:
    break;
  }
  vVar5 = checksum(this);
  return vVar5 == expected_crc;
}

Assistant:

bool my_crc_basic::calc_crc(value_type const use_initial,
			    boost::dynamic_bitset<> const& msg,
			    value_type const expected_crc,
			    FEED_TYPE feed_type) {
  
  reset(use_initial);	


  if(feed_type == AUTO) {
    if(rft_in_) {
      if (msg.size() % 8 != 0) feed_type = LINEAR_REVERSED;
      else feed_type = BYTEWISE_REVERSED;
    }
    else {
      feed_type = LINEAR_FORWARD;
    }
  }


  
  if(feed_type == LINEAR_FORWARD) {
    for (size_t i = 0; i < msg.size(); i++) {
      process_bit(msg[i]);
    }
  }
  else if(feed_type == LINEAR_REVERSED) {
    for (int i = msg.size()-1; i >= 0; i--) {
      process_bit(msg[i]);
    }
  }
  else if(feed_type == BYTEWISE_REVERSED) {

      for(size_t i = 0; i < msg.size(); i+=8) {
	// inverse feeding
	for(int j = 1; j <= 8; j++)
	  process_bit(msg[i + 8 - j]);
      }
  }
  
  return checksum() == expected_crc;
}